

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O2

bool __thiscall
chrono::ChArchiveExplorer::IsObject<std::vector<myEmployee,std::allocator<myEmployee>>>
          (ChArchiveExplorer *this,vector<myEmployee,_std::allocator<myEmployee>_> *root)

{
  allocator local_51;
  string local_50;
  ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_> local_30;
  
  std::__cxx11::string::string((string *)&local_50,"_",&local_51);
  PrepareSearch(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_30._name = "";
  local_30._flags = '\0';
  local_30._value = root;
  ChArchiveOut::operator<<(&this->super_ChArchiveOut,&local_30);
  return this->found_obj;
}

Assistant:

bool IsObject(const T& root) {

          this->PrepareSearch("_");
          this->operator<<( CHNVP(root,"") ); // SCAN! 
          if (this->found_obj) 
              return true;
          else 
              return false;
      }